

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

void __thiscall APowerInvisibility::InitEffect(APowerInvisibility *this)

{
  int iVar1;
  bool bVar2;
  AActor *pAVar3;
  TFlags<ActorFlag5,_unsigned_int> local_34;
  TFlags<ActorFlag5,_unsigned_int> local_30;
  TFlags<ActorFlag5,_unsigned_int> local_2c;
  TFlags<ActorFlag3,_unsigned_int> local_28;
  TFlags<ActorFlag3,_unsigned_int> local_24;
  TFlags<ActorFlag3,_unsigned_int> local_20;
  TFlags<ActorFlag,_unsigned_int> local_1c;
  TFlags<ActorFlag,_unsigned_int> local_18;
  TFlags<ActorFlag,_unsigned_int> local_14;
  APowerInvisibility *local_10;
  APowerInvisibility *this_local;
  
  local_10 = this;
  APowerup::InitEffect(&this->super_APowerup);
  bVar2 = TObjPtr<AActor>::operator!=(&(this->super_APowerup).super_AInventory.Owner,(AActor *)0x0);
  if (bVar2) {
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_18,
               (int)pAVar3 +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    TFlags<ActorFlag,_unsigned_int>::operator~(&local_14);
    TFlags<ActorFlag,_unsigned_int>::operator&=
              (&(this->super_APowerup).super_AInventory.super_AActor.flags,&local_14);
    iVar1 = (int)this;
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_1c,
               iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                       MF_SHOOTABLE));
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    TFlags<ActorFlag,_unsigned_int>::operator|=(&pAVar3->flags,&local_1c);
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    TFlags<ActorFlag3,_unsigned_int>::operator&
              (&local_24,
               (int)pAVar3 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
    TFlags<ActorFlag3,_unsigned_int>::operator~(&local_20);
    TFlags<ActorFlag3,_unsigned_int>::operator&=
              (&(this->super_APowerup).super_AInventory.super_AActor.flags3,&local_20);
    TFlags<ActorFlag3,_unsigned_int>::operator&
              (&local_28,iVar1 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    TFlags<ActorFlag3,_unsigned_int>::operator|=(&pAVar3->flags3,&local_28);
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    TFlags<ActorFlag5,_unsigned_int>::operator&
              (&local_30,
               (int)pAVar3 +
               (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF));
    TFlags<ActorFlag5,_unsigned_int>::operator~(&local_2c);
    TFlags<ActorFlag5,_unsigned_int>::operator&=
              (&(this->super_APowerup).super_AInventory.super_AActor.flags5,&local_2c);
    TFlags<ActorFlag5,_unsigned_int>::operator&
              (&local_34,
               iVar1 + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF
                       ));
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    TFlags<ActorFlag5,_unsigned_int>::operator|=(&pAVar3->flags5,&local_34);
    (*(this->super_APowerup).super_AInventory.super_AActor.super_DThinker.super_DObject.
      _vptr_DObject[0x27])();
  }
  return;
}

Assistant:

void APowerInvisibility::InitEffect ()
{
	Super::InitEffect();
	// This used to call CommonInit(), which used to contain all the code that's repeated every
	// tic, plus the following code that needs to happen once and only once.
	// The CommonInit() code has been moved to DoEffect(), so this now ends with a call to DoEffect(),
	// and DoEffect() no longer needs to call InitEffect(). CommonInit() has been removed for being redundant.
	if (Owner != NULL)
	{
		flags &= ~(Owner->flags  & INVISIBILITY_FLAGS1);
		Owner->flags  |= flags & INVISIBILITY_FLAGS1;
		flags3 &= ~(Owner->flags3 & INVISIBILITY_FLAGS3);
		Owner->flags3 |= flags3 & INVISIBILITY_FLAGS3;
		flags5 &= ~(Owner->flags5 & INVISIBILITY_FLAGS5);
		Owner->flags5 |= flags5 & INVISIBILITY_FLAGS5;

		DoEffect();
	}
}